

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  __m256i c;
  __m256i c_00;
  int iVar6;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar7;
  __m256i *palVar8;
  __m256i *b_00;
  ulong uVar9;
  ulong uVar10;
  __m256i *ptr;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  short sVar16;
  uint uVar17;
  __m256i *palVar18;
  undefined2 uVar19;
  undefined2 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined8 in_stack_ffffffffffffff18;
  uint uVar35;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar36;
  undefined1 auVar22 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar1 = (profile->profile16).score;
    if (pvVar1 == (void *)0x0) {
      parasail_sw_striped_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_avx2_256_16_cold_6();
      }
      else {
        uVar11 = profile->s1Len;
        if ((int)uVar11 < 1) {
          parasail_sw_striped_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_avx2_256_16_cold_1();
        }
        else {
          iVar6 = ppVar2->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar9 = (ulong)uVar11 + 0xf;
            uVar10 = uVar9 >> 4;
            result->flag = result->flag | 0x10200804;
            b = parasail_memalign___m256i(0x20,uVar10);
            palVar7 = parasail_memalign___m256i(0x20,uVar10);
            palVar8 = parasail_memalign___m256i(0x20,uVar10);
            b_00 = parasail_memalign___m256i(0x20,uVar10);
            if ((b_00 != (__m256i *)0x0 && palVar8 != (__m256i *)0x0) &&
                (palVar7 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              iVar12 = 0;
              uVar36 = 0;
              uVar19 = (undefined2)open;
              uVar20 = (undefined2)gap;
              c[1]._0_4_ = iVar6;
              c[0] = in_stack_ffffffffffffff18;
              c[1]._4_4_ = in_stack_ffffffffffffff24;
              c[2] = (longlong)result;
              c[3] = 0;
              parasail_memset___m256i(b,c,uVar10);
              c_00[1]._0_4_ = iVar6;
              c_00[0] = in_stack_ffffffffffffff18;
              c_00[1]._4_4_ = in_stack_ffffffffffffff24;
              c_00[2] = (longlong)result;
              c_00[3]._0_4_ = iVar12;
              c_00[3]._4_4_ = uVar36;
              parasail_memset___m256i(b_00,c_00,uVar10);
              auVar3._2_2_ = uVar20;
              auVar3._0_2_ = uVar20;
              auVar3._4_2_ = uVar20;
              auVar3._6_2_ = uVar20;
              auVar3._8_2_ = uVar20;
              auVar3._10_2_ = uVar20;
              auVar3._12_2_ = uVar20;
              auVar3._14_2_ = uVar20;
              auVar3._16_2_ = uVar20;
              auVar3._18_2_ = uVar20;
              auVar3._20_2_ = uVar20;
              auVar3._22_2_ = uVar20;
              auVar3._24_2_ = uVar20;
              auVar3._26_2_ = uVar20;
              auVar3._28_2_ = uVar20;
              auVar3._30_2_ = uVar20;
              auVar4._2_2_ = uVar19;
              auVar4._0_2_ = uVar19;
              auVar4._4_2_ = uVar19;
              auVar4._6_2_ = uVar19;
              auVar4._8_2_ = uVar19;
              auVar4._10_2_ = uVar19;
              auVar4._12_2_ = uVar19;
              auVar4._14_2_ = uVar19;
              auVar4._16_2_ = uVar19;
              auVar4._18_2_ = uVar19;
              auVar4._20_2_ = uVar19;
              auVar4._22_2_ = uVar19;
              auVar4._24_2_ = uVar19;
              auVar4._26_2_ = uVar19;
              auVar4._28_2_ = uVar19;
              auVar4._30_2_ = uVar19;
              uVar35 = (uint)uVar10;
              uVar17 = 0x8000;
              auVar21._8_2_ = 0x8000;
              auVar21._0_8_ = 0x8000800080008000;
              auVar21._10_2_ = 0x8000;
              auVar21._12_2_ = 0x8000;
              auVar21._14_2_ = 0x8000;
              auVar22._16_2_ = 0x8000;
              auVar22._0_16_ = auVar21;
              auVar22._18_2_ = 0x8000;
              auVar22._20_2_ = 0x8000;
              auVar22._22_2_ = 0x8000;
              auVar22._24_2_ = 0x8000;
              auVar22._26_2_ = 0x8000;
              auVar22._28_2_ = 0x8000;
              auVar22._30_2_ = 0x8000;
              auVar24._8_2_ = 0x8000;
              auVar24._0_8_ = 0x8000800080008000;
              auVar24._10_2_ = 0x8000;
              auVar24._12_2_ = 0x8000;
              auVar24._14_2_ = 0x8000;
              uVar13 = 0;
              auVar28 = ZEXT3264(auVar22);
              auVar27 = ZEXT3264(auVar22);
              do {
                ptr = b;
                iVar14 = ppVar2->mapper[(byte)s2[uVar13]];
                iVar5 = (int)uVar13;
                palVar18 = palVar8;
                b = palVar7;
                if (iVar12 == iVar5 + -2) {
                  palVar18 = palVar7;
                  b = palVar8;
                }
                auVar25 = SUB3216(ptr[uVar35 - 1],0);
                auVar34._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar21;
                auVar34._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar25;
                auVar34 = vpalignr_avx2((undefined1  [32])ptr[uVar35 - 1],auVar34,0xe);
                auVar25 = vpblendw_avx(auVar34._0_16_,auVar21,1);
                auVar34 = vpblendd_avx2(ZEXT1632(auVar25),auVar34,0xf0);
                lVar15 = 0;
                auVar32 = ZEXT3264(auVar22);
                do {
                  auVar29 = vpaddsw_avx2(auVar34,*(undefined1 (*) [32])
                                                  ((long)pvVar1 +
                                                  lVar15 + (long)iVar14 * uVar10 * 0x20));
                  auVar34 = *(undefined1 (*) [32])((long)*b_00 + lVar15);
                  auVar30 = vpmaxsw_avx2(auVar34,auVar32._0_32_);
                  auVar29 = vpmaxsw_avx2(auVar29,auVar30);
                  *(undefined1 (*) [32])((long)*b + lVar15) = auVar29;
                  auVar30 = vpmaxsw_avx2(auVar29,auVar27._0_32_);
                  auVar27 = ZEXT3264(auVar30);
                  auVar29 = vpsubsw_avx2(auVar29,auVar4);
                  auVar34 = vpsubsw_avx2(auVar34,auVar3);
                  auVar34 = vpmaxsw_avx2(auVar34,auVar29);
                  *(undefined1 (*) [32])((long)*b_00 + lVar15) = auVar34;
                  auVar34 = vpsubsw_avx2(auVar32._0_32_,auVar3);
                  auVar34 = vpmaxsw_avx2(auVar34,auVar29);
                  auVar32 = ZEXT3264(auVar34);
                  auVar34 = *(undefined1 (*) [32])((long)*ptr + lVar15);
                  lVar15 = lVar15 + 0x20;
                } while (uVar10 << 5 != lVar15);
                iVar14 = 0;
                do {
                  auVar29._0_16_ = ZEXT116(0) * auVar32._0_16_ + ZEXT116(1) * auVar21;
                  auVar29._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar32._0_16_;
                  auVar34 = vpalignr_avx2(auVar32._0_32_,auVar29,0xe);
                  auVar25 = vpblendw_avx(auVar34._0_16_,auVar24,1);
                  auVar34 = vpblendd_avx2(ZEXT1632(auVar25),auVar34,0xf0);
                  auVar32 = ZEXT3264(auVar34);
                  lVar15 = 0;
                  do {
                    auVar34 = vpmaxsw_avx2(auVar32._0_32_,*(undefined1 (*) [32])((long)*b + lVar15))
                    ;
                    *(undefined1 (*) [32])((long)*b + lVar15) = auVar34;
                    auVar29 = vpmaxsw_avx2(auVar34,auVar27._0_32_);
                    auVar27 = ZEXT3264(auVar29);
                    auVar34 = vpsubsw_avx2(auVar34,auVar4);
                    auVar30 = vpsubsw_avx2(auVar32._0_32_,auVar3);
                    auVar32 = ZEXT3264(auVar30);
                    auVar34 = vpcmpgtw_avx2(auVar30,auVar34);
                    if ((((((((((((((((((((((((((((((((auVar34 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar34 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar34 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar34 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar34 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar34 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar34 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar34 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar34 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar34 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar34 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar34 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar34 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar34 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar34 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar34 >> 0x7f,0) == '\0')
                                      && (auVar34 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar34 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar34 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar34 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar34 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar34 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar34 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar34 >> 0xbf,0) == '\0') &&
                              (auVar34 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar34 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar34 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar34 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar34 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar34 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar34 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar34[0x1f]) goto LAB_00777096;
                    lVar15 = lVar15 + 0x20;
                  } while (uVar10 << 5 != lVar15);
                  iVar14 = iVar14 + 1;
                } while (iVar14 != 0x10);
LAB_00777096:
                auVar34 = vpcmpgtw_avx2(auVar29,auVar28._0_32_);
                if ((((((((((((((((((((((((((((((((auVar34 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar34 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar34 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar34 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar34 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar34 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar34 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar34 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar34 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar34 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar34 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar34 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar34 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar34 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar34 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar34 >> 0x7f,0) != '\0') ||
                                  (auVar34 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar34 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar34 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar34 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar34 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar34 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar34 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar34 >> 0xbf,0) != '\0') ||
                          (auVar34 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar34 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar34 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar34 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar34 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar34 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar34 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar34[0x1f] < '\0') {
                  auVar34 = vpermq_avx2(auVar29,0x44);
                  auVar34 = vpmaxsw_avx2(auVar29,auVar34);
                  auVar29 = vpslldq_avx2(auVar34,8);
                  auVar34 = vpmaxsw_avx2(auVar34,auVar29);
                  auVar29 = vpslldq_avx2(auVar34,4);
                  auVar34 = vpmaxsw_avx2(auVar34,auVar29);
                  auVar29 = vpslldq_avx2(auVar34,2);
                  auVar34 = vpmaxsw_avx2(auVar34,auVar29);
                  uVar17 = vpextrw_avx(auVar34._16_16_,7);
                  if ((short)(0x7ffe - (short)iVar6) < (short)uVar17) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    s2Len = iVar5;
                    break;
                  }
                  auVar34 = vpshufhw_avx2(auVar34,0xff);
                  auVar30._8_4_ = 6;
                  auVar30._0_8_ = 0x600000006;
                  auVar30._12_4_ = 6;
                  auVar30._16_4_ = 6;
                  auVar30._20_4_ = 6;
                  auVar30._24_4_ = 6;
                  auVar30._28_4_ = 6;
                  auVar34 = vpermd_avx2(auVar30,auVar34);
                  auVar28 = ZEXT3264(auVar34);
                  iVar12 = iVar5;
                }
                uVar13 = uVar13 + 1;
                palVar7 = ptr;
                palVar8 = palVar18;
              } while (uVar13 != (uint)s2Len);
              if ((uVar17 & 0xffff) == 0x7fff) {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
              }
              iVar6 = parasail_result_is_saturated(result);
              palVar7 = palVar18;
              if (iVar6 == 0) {
                palVar8 = ptr;
                if (iVar12 == s2Len + -2) {
                  palVar7 = ptr;
                  palVar8 = palVar18;
                }
                if (iVar12 == s2Len + -1) {
                  palVar7 = b;
                  b = palVar18;
                  palVar8 = ptr;
                }
                ptr = palVar8;
                uVar11 = uVar11 - 1;
                sVar16 = (short)uVar17;
                if ((uVar9 & 0x7ffffff0) != 0) {
                  if ((uVar9 & 0x7ffffff0) == 0) {
                    uVar9 = 0;
                    do {
                      if ((*(short *)((long)*palVar7 + uVar9 * 2) == sVar16) &&
                         (uVar17 = ((uint)uVar9 & 0xf) * uVar35 | (uint)(uVar9 >> 4) & 0xfffffff,
                         (int)uVar17 < (int)uVar11)) {
                        uVar11 = uVar17;
                      }
                      uVar9 = uVar9 + 1;
                    } while ((uVar35 & 0x7ffffff) << 4 != (int)uVar9);
                  }
                  else {
                    auVar23._4_4_ = uVar11;
                    auVar23._0_4_ = uVar11;
                    auVar23._8_4_ = uVar11;
                    auVar23._12_4_ = uVar11;
                    auVar23._16_4_ = uVar11;
                    auVar23._20_4_ = uVar11;
                    auVar23._24_4_ = uVar11;
                    auVar23._28_4_ = uVar11;
                    auVar25._2_2_ = sVar16;
                    auVar25._0_2_ = sVar16;
                    auVar25._4_2_ = sVar16;
                    auVar25._6_2_ = sVar16;
                    auVar25._8_2_ = sVar16;
                    auVar25._10_2_ = sVar16;
                    auVar25._12_2_ = sVar16;
                    auVar25._14_2_ = sVar16;
                    auVar26._4_4_ = uVar35;
                    auVar26._0_4_ = uVar35;
                    auVar26._8_4_ = uVar35;
                    auVar26._12_4_ = uVar35;
                    auVar26._16_4_ = uVar35;
                    auVar26._20_4_ = uVar35;
                    auVar26._24_4_ = uVar35;
                    auVar26._28_4_ = uVar35;
                    auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                    uVar10 = 0;
                    auVar31._8_4_ = 0xf;
                    auVar31._0_8_ = 0xf0000000f;
                    auVar31._12_4_ = 0xf;
                    auVar31._16_4_ = 0xf;
                    auVar31._20_4_ = 0xf;
                    auVar31._24_4_ = 0xf;
                    auVar31._28_4_ = 0xf;
                    auVar33._8_4_ = 8;
                    auVar33._0_8_ = 0x800000008;
                    auVar33._12_4_ = 8;
                    auVar33._16_4_ = 8;
                    auVar33._20_4_ = 8;
                    auVar33._24_4_ = 8;
                    auVar33._28_4_ = 8;
                    do {
                      auVar21 = vpcmpeqw_avx(auVar25,*(undefined1 (*) [16])
                                                      ((long)*palVar7 + uVar10 * 2));
                      auVar22 = vpmovsxwd_avx2(auVar21);
                      auVar34 = vpsrld_avx2(auVar4,4);
                      auVar3 = vpand_avx2(auVar4,auVar31);
                      auVar3 = vpmulld_avx2(auVar3,auVar26);
                      auVar3 = vpaddd_avx2(auVar3,auVar34);
                      auVar3 = vpminsd_avx2(auVar3,auVar23);
                      auVar23 = vblendvps_avx(auVar23,auVar3,auVar22);
                      uVar10 = uVar10 + 8;
                      auVar4 = vpaddd_avx2(auVar4,auVar33);
                    } while (((uint)uVar9 & 0x7ffffff0) != uVar10);
                    auVar21 = vpminsd_avx(auVar23._0_16_,auVar23._16_16_);
                    auVar24 = vpshufd_avx(auVar21,0xee);
                    auVar21 = vpminsd_avx(auVar21,auVar24);
                    auVar24 = vpshufd_avx(auVar21,0x55);
                    auVar21 = vpminsd_avx(auVar21,auVar24);
                    uVar11 = auVar21._0_4_;
                  }
                }
                iVar6 = sVar16 + 0x8000;
              }
              else {
                iVar12 = 0;
                iVar6 = 0xffff;
                uVar11 = 0;
              }
              result->score = iVar6;
              result->end_query = uVar11;
              result->end_ref = iVar12;
              parasail_free(b_00);
              parasail_free(palVar7);
              parasail_free(ptr);
              parasail_free(b);
              return result;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int16_t maxp = 0;
    __m256i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm256_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi16(
            _mm256_set_epi16(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}